

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O3

void finalize_preconditioner<sparse_parameters>
               (vw *param_1,bfgs *b,float regularization,sparse_parameters *weights)

{
  float fVar1;
  _Hash_node_base *p_Var2;
  anon_union_4_2_947300a4 x;
  float fVar3;
  
  if (b->regularizers == (weight *)0x0) {
    p_Var2 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      fVar3 = 0.0;
      do {
        *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4) =
             *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4) + regularization;
        fVar1 = *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4);
        if (0.0 < fVar1) {
          *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4) = 1.0 / fVar1;
        }
        if (fVar1 <= fVar3) {
          fVar1 = fVar3;
        }
        fVar3 = fVar1;
        p_Var2 = p_Var2->_M_nxt;
      } while (p_Var2 != (_Hash_node_base *)0x0);
      goto LAB_001dac3e;
    }
  }
  else {
    p_Var2 = (weights->_map)._M_h._M_before_begin._M_nxt;
    if (p_Var2 != (_Hash_node_base *)0x0) {
      fVar3 = 0.0;
      do {
        *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4) =
             b->regularizers[((ulong)p_Var2[1]._M_nxt >> ((byte)weights->_stride_shift & 0x3f)) * 2]
             + *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4);
        fVar1 = *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4);
        if (0.0 < fVar1) {
          *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4) = 1.0 / fVar1;
        }
        if (fVar1 <= fVar3) {
          fVar1 = fVar3;
        }
        fVar3 = fVar1;
        p_Var2 = p_Var2->_M_nxt;
      } while (p_Var2 != (_Hash_node_base *)0x0);
      goto LAB_001dac3e;
    }
  }
  fVar3 = 0.0;
LAB_001dac3e:
  p_Var2 = (weights->_map)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    fVar3 = (float)(~-(uint)(fVar3 == 0.0) & (uint)(10000.0 / fVar3));
    do {
      fVar1 = *(float *)&(p_Var2[2]._M_nxt)->_M_nxt;
      if ((((uint)fVar1 & 0x7fc00000) == 0x7f800000) || (fVar3 < fVar1)) {
        *(float *)((long)&p_Var2[2]._M_nxt[1]._M_nxt + 4) = fVar3;
      }
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void finalize_preconditioner(vw& /* all */, bfgs& b, float regularization, T& weights)
{
  float max_hessian = 0.f;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += regularization;
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_COND] += b.regularizers[2 * (w.index() >> weights.stride_shift())];
      if ((&(*w))[W_COND] > max_hessian)
        max_hessian = (&(*w))[W_COND];
      if ((&(*w))[W_COND] > 0)
        (&(*w))[W_COND] = 1.f / (&(*w))[W_COND];
    }

  float max_precond = (max_hessian == 0.f) ? 0.f : max_precond_ratio / max_hessian;

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
  {
    if (infpattern(*w) || *w > max_precond)
      (&(*w))[W_COND] = max_precond;
  }
}